

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

int Bmc_ComputeCanonical(sat_solver *pSat,Vec_Int_t *vLits,Vec_Int_t *vTemp,int nBTLimit)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int i;
  
  i = 0;
  iVar4 = 0;
  do {
    if (vLits->nSize <= i) {
      if (iVar4 == 1) {
        return 1;
      }
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcClp.c"
                    ,0x268,"int Bmc_ComputeCanonical(sat_solver *, Vec_Int_t *, Vec_Int_t *, int)");
    }
    vTemp->nSize = 0;
    for (iVar4 = 0; iVar4 <= i; iVar4 = iVar4 + 1) {
      iVar1 = Vec_IntEntry(vLits,iVar4);
      Vec_IntPush(vTemp,iVar1);
    }
    iVar4 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,(long)nBTLimit,0,0,0);
    if (iVar4 != 1) {
      if (iVar4 == 0) {
        return 0;
      }
      iVar1 = Vec_IntEntry(vLits,i);
      iVar2 = Abc_LitIsCompl(iVar1);
      if (iVar2 == 0) {
        return -1;
      }
      iVar1 = Abc_LitNot(iVar1);
      Vec_IntWriteEntry(vLits,i,iVar1);
      iVar1 = i;
      while (iVar1 = iVar1 + 1, iVar1 < vLits->nSize) {
        uVar3 = Vec_IntEntry(vLits,iVar1);
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x110,"int Abc_LitRegular(int)");
        }
        iVar2 = Abc_LitNot(uVar3 & 0x7ffffffe);
        Vec_IntWriteEntry(vLits,iVar1,iVar2);
      }
      i = i + -1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Bmc_ComputeCanonical( sat_solver * pSat, Vec_Int_t * vLits, Vec_Int_t * vTemp, int nBTLimit )
{
    int i, k, iLit, status = l_Undef;
    for ( i = 0; i < Vec_IntSize(vLits); i++ )
    {
        // copy the first i+1 literals
        Vec_IntClear( vTemp );
        Vec_IntForEachEntryStop( vLits, iLit, k, i+1 )
            Vec_IntPush( vTemp, iLit );
        // check if it satisfies the on-set
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return l_Undef;
        if ( status == l_True )
            continue;
        // if it is UNSAT, try the opposite literal
        iLit = Vec_IntEntry( vLits, i );
        // if literal is positive, there is no way to flip it
        if ( !Abc_LitIsCompl(iLit) )
            return l_False;
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(iLit) );
        Vec_IntForEachEntryStart( vLits, iLit, k, i+1 )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(Abc_LitRegular(iLit)) );
        // recheck
        i--;
    }
    assert( status == l_True );
    return status;
}